

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash2012.c
# Opt level: O2

void g(uint512_u *h,uint512_u *N,uint512_u *m)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  auVar6 = *(undefined1 (*) [16])N ^ *(undefined1 (*) [16])h;
  auVar4 = *(undefined1 (*) [16])(N->QWORD + 2) ^ *(undefined1 (*) [16])(h->QWORD + 2);
  auVar2 = *(undefined1 (*) [16])(N->QWORD + 4) ^ *(undefined1 (*) [16])(h->QWORD + 4);
  auVar5 = *(undefined1 (*) [16])(N->QWORD + 6) ^ *(undefined1 (*) [16])(h->QWORD + 6);
  auVar19._8_8_ =
       Ax[1][(ushort)(auVar6._8_2_ >> 8)] ^ Ax[0][auVar6._0_4_ >> 8 & 0xff] ^
       Ax[2][auVar4._0_4_ >> 8 & 0xff] ^ Ax[3][(ushort)(auVar4._8_2_ >> 8)] ^
       Ax[4][auVar2._0_4_ >> 8 & 0xff] ^ Ax[5][(ushort)(auVar2._8_2_ >> 8)] ^
       Ax[6][auVar5._0_4_ >> 8 & 0xff] ^ Ax[7][(ushort)(auVar5._8_2_ >> 8)];
  auVar19._0_8_ =
       Ax[1][auVar6._8_2_ & 0xff] ^ Ax[0][auVar6._0_4_ & 0xff] ^ Ax[2][auVar4._0_4_ & 0xff] ^
       Ax[3][auVar4._8_2_ & 0xff] ^ Ax[4][auVar2._0_4_ & 0xff] ^ Ax[5][auVar2._8_2_ & 0xff] ^
       Ax[6][auVar5._0_4_ & 0xff] ^ Ax[7][auVar5._8_2_ & 0xff];
  auVar17._8_8_ =
       Ax[1][(ushort)(auVar6._10_2_ >> 8)] ^ Ax[0][(ushort)(auVar6._2_2_ >> 8)] ^
       Ax[2][(ushort)(auVar4._2_2_ >> 8)] ^ Ax[3][(ushort)(auVar4._10_2_ >> 8)] ^
       Ax[4][(ushort)(auVar2._2_2_ >> 8)] ^ Ax[5][(ushort)(auVar2._10_2_ >> 8)] ^
       Ax[6][(ushort)(auVar5._2_2_ >> 8)] ^ Ax[7][(ushort)(auVar5._10_2_ >> 8)];
  auVar17._0_8_ =
       Ax[1][auVar6._10_2_ & 0xff] ^ Ax[0][auVar6._2_2_ & 0xff] ^ Ax[2][auVar4._2_2_ & 0xff] ^
       Ax[3][auVar4._10_2_ & 0xff] ^ Ax[4][auVar2._2_2_ & 0xff] ^ Ax[5][auVar2._10_2_ & 0xff] ^
       Ax[6][auVar5._2_2_ & 0xff] ^ Ax[7][auVar5._10_2_ & 0xff];
  auVar15._8_8_ =
       Ax[1][(ushort)(auVar6._12_2_ >> 8)] ^ Ax[0][(ushort)(auVar6._4_2_ >> 8)] ^
       Ax[2][(ushort)(auVar4._4_2_ >> 8)] ^ Ax[3][(ushort)(auVar4._12_2_ >> 8)] ^
       Ax[4][(ushort)(auVar2._4_2_ >> 8)] ^ Ax[5][(ushort)(auVar2._12_2_ >> 8)] ^
       Ax[6][(ushort)(auVar5._4_2_ >> 8)] ^ Ax[7][(ushort)(auVar5._12_2_ >> 8)];
  auVar15._0_8_ =
       Ax[1][auVar6._12_2_ & 0xff] ^ Ax[0][auVar6._4_2_ & 0xff] ^ Ax[2][auVar4._4_2_ & 0xff] ^
       Ax[3][auVar4._12_2_ & 0xff] ^ Ax[4][auVar2._4_2_ & 0xff] ^ Ax[5][auVar2._12_2_ & 0xff] ^
       Ax[6][auVar5._4_2_ & 0xff] ^ Ax[7][auVar5._12_2_ & 0xff];
  auVar7._8_8_ = Ax[1][(ushort)(auVar6._14_2_ >> 8)] ^ Ax[0][(ushort)(auVar6._6_2_ >> 8)] ^
                 Ax[2][(ushort)(auVar4._6_2_ >> 8)] ^ Ax[3][(ushort)(auVar4._14_2_ >> 8)] ^
                 Ax[4][(ushort)(auVar2._6_2_ >> 8)] ^ Ax[5][(ushort)(auVar2._14_2_ >> 8)] ^
                 Ax[6][(ushort)(auVar5._6_2_ >> 8)] ^ Ax[7][(ushort)(auVar5._14_2_ >> 8)];
  auVar7._0_8_ = Ax[1][auVar6._14_2_ & 0xff] ^ Ax[0][auVar6._6_2_ & 0xff] ^
                 Ax[2][auVar4._6_2_ & 0xff] ^ Ax[3][auVar4._14_2_ & 0xff] ^
                 Ax[4][auVar2._6_2_ & 0xff] ^ Ax[5][auVar2._14_2_ & 0xff] ^
                 Ax[6][auVar5._6_2_ & 0xff] ^ Ax[7][auVar5._14_2_ & 0xff];
  auVar2 = *(undefined1 (*) [16])(m->QWORD + 2);
  auVar4 = *(undefined1 (*) [16])(m->QWORD + 4);
  auVar5 = *(undefined1 (*) [16])(m->QWORD + 6);
  auVar8 = *(undefined1 (*) [16])m ^ auVar19;
  auVar10 = auVar2 ^ auVar17;
  auVar13 = auVar4 ^ auVar15;
  auVar6 = auVar5 ^ auVar7;
  auVar9._8_8_ = Ax[1][(ushort)(auVar8._8_2_ >> 8)] ^ Ax[0][auVar8._0_4_ >> 8 & 0xff] ^
                 Ax[2][auVar10._0_4_ >> 8 & 0xff] ^ Ax[3][(ushort)(auVar10._8_2_ >> 8)] ^
                 Ax[4][auVar13._0_4_ >> 8 & 0xff] ^ Ax[5][(ushort)(auVar13._8_2_ >> 8)] ^
                 Ax[6][auVar6._0_4_ >> 8 & 0xff] ^ Ax[7][(ushort)(auVar6._8_2_ >> 8)];
  auVar9._0_8_ = Ax[1][auVar8._8_2_ & 0xff] ^ Ax[0][auVar8._0_4_ & 0xff] ^
                 Ax[2][auVar10._0_4_ & 0xff] ^ Ax[3][auVar10._8_2_ & 0xff] ^
                 Ax[4][auVar13._0_4_ & 0xff] ^ Ax[5][auVar13._8_2_ & 0xff] ^
                 Ax[6][auVar6._0_4_ & 0xff] ^ Ax[7][auVar6._8_2_ & 0xff];
  auVar12._8_8_ =
       Ax[1][(ushort)(auVar8._10_2_ >> 8)] ^ Ax[0][(ushort)(auVar8._2_2_ >> 8)] ^
       Ax[2][(ushort)(auVar10._2_2_ >> 8)] ^ Ax[3][(ushort)(auVar10._10_2_ >> 8)] ^
       Ax[4][(ushort)(auVar13._2_2_ >> 8)] ^ Ax[5][(ushort)(auVar13._10_2_ >> 8)] ^
       Ax[6][(ushort)(auVar6._2_2_ >> 8)] ^ Ax[7][(ushort)(auVar6._10_2_ >> 8)];
  auVar12._0_8_ =
       Ax[1][auVar8._10_2_ & 0xff] ^ Ax[0][auVar8._2_2_ & 0xff] ^ Ax[2][auVar10._2_2_ & 0xff] ^
       Ax[3][auVar10._10_2_ & 0xff] ^ Ax[4][auVar13._2_2_ & 0xff] ^ Ax[5][auVar13._10_2_ & 0xff] ^
       Ax[6][auVar6._2_2_ & 0xff] ^ Ax[7][auVar6._10_2_ & 0xff];
  auVar3._8_8_ = Ax[1][(ushort)(auVar8._12_2_ >> 8)] ^ Ax[0][(ushort)(auVar8._4_2_ >> 8)] ^
                 Ax[2][(ushort)(auVar10._4_2_ >> 8)] ^ Ax[3][(ushort)(auVar10._12_2_ >> 8)] ^
                 Ax[4][(ushort)(auVar13._4_2_ >> 8)] ^ Ax[5][(ushort)(auVar13._12_2_ >> 8)] ^
                 Ax[6][(ushort)(auVar6._4_2_ >> 8)] ^ Ax[7][(ushort)(auVar6._12_2_ >> 8)];
  auVar3._0_8_ = Ax[1][auVar8._12_2_ & 0xff] ^ Ax[0][auVar8._4_2_ & 0xff] ^
                 Ax[2][auVar10._4_2_ & 0xff] ^ Ax[3][auVar10._12_2_ & 0xff] ^
                 Ax[4][auVar13._4_2_ & 0xff] ^ Ax[5][auVar13._12_2_ & 0xff] ^
                 Ax[6][auVar6._4_2_ & 0xff] ^ Ax[7][auVar6._12_2_ & 0xff];
  auVar11._8_8_ =
       Ax[1][(ushort)(auVar8._14_2_ >> 8)] ^ Ax[0][(ushort)(auVar8._6_2_ >> 8)] ^
       Ax[2][(ushort)(auVar10._6_2_ >> 8)] ^ Ax[3][(ushort)(auVar10._14_2_ >> 8)] ^
       Ax[4][(ushort)(auVar13._6_2_ >> 8)] ^ Ax[5][(ushort)(auVar13._14_2_ >> 8)] ^
       Ax[6][(ushort)(auVar6._6_2_ >> 8)] ^ Ax[7][(ushort)(auVar6._14_2_ >> 8)];
  auVar11._0_8_ =
       Ax[1][auVar8._14_2_ & 0xff] ^ Ax[0][auVar8._6_2_ & 0xff] ^ Ax[2][auVar10._6_2_ & 0xff] ^
       Ax[3][auVar10._14_2_ & 0xff] ^ Ax[4][auVar13._6_2_ & 0xff] ^ Ax[5][auVar13._14_2_ & 0xff] ^
       Ax[6][auVar6._6_2_ & 0xff] ^ Ax[7][auVar6._14_2_ & 0xff];
  for (lVar1 = 0x30; lVar1 != 0x2f0; lVar1 = lVar1 + 0x40) {
    auVar18 = auVar19 ^ *(undefined1 (*) [16])((long)Ax[7] + lVar1 + 2000);
    auVar16 = auVar17 ^ *(undefined1 (*) [16])((long)Ax[7] + lVar1 + 0x7e0);
    auVar14 = auVar15 ^ *(undefined1 (*) [16])((long)Ax[7] + lVar1 + 0x7f0);
    auVar6 = auVar7 ^ *(undefined1 (*) [16])((long)C + lVar1);
    auVar19._8_8_ =
         Ax[1][(ushort)(auVar18._8_2_ >> 8)] ^ Ax[0][auVar18._0_4_ >> 8 & 0xff] ^
         Ax[2][auVar16._0_4_ >> 8 & 0xff] ^ Ax[3][(ushort)(auVar16._8_2_ >> 8)] ^
         Ax[4][auVar14._0_4_ >> 8 & 0xff] ^ Ax[5][(ushort)(auVar14._8_2_ >> 8)] ^
         Ax[6][auVar6._0_4_ >> 8 & 0xff] ^ Ax[7][(ushort)(auVar6._8_2_ >> 8)];
    auVar19._0_8_ =
         Ax[1][auVar18._8_2_ & 0xff] ^ Ax[0][auVar18._0_4_ & 0xff] ^ Ax[2][auVar16._0_4_ & 0xff] ^
         Ax[3][auVar16._8_2_ & 0xff] ^ Ax[4][auVar14._0_4_ & 0xff] ^ Ax[5][auVar14._8_2_ & 0xff] ^
         Ax[6][auVar6._0_4_ & 0xff] ^ Ax[7][auVar6._8_2_ & 0xff];
    auVar17._8_8_ =
         Ax[1][(ushort)(auVar18._10_2_ >> 8)] ^ Ax[0][(ushort)(auVar18._2_2_ >> 8)] ^
         Ax[2][(ushort)(auVar16._2_2_ >> 8)] ^ Ax[3][(ushort)(auVar16._10_2_ >> 8)] ^
         Ax[4][(ushort)(auVar14._2_2_ >> 8)] ^ Ax[5][(ushort)(auVar14._10_2_ >> 8)] ^
         Ax[6][(ushort)(auVar6._2_2_ >> 8)] ^ Ax[7][(ushort)(auVar6._10_2_ >> 8)];
    auVar17._0_8_ =
         Ax[1][auVar18._10_2_ & 0xff] ^ Ax[0][auVar18._2_2_ & 0xff] ^ Ax[2][auVar16._2_2_ & 0xff] ^
         Ax[3][auVar16._10_2_ & 0xff] ^ Ax[4][auVar14._2_2_ & 0xff] ^ Ax[5][auVar14._10_2_ & 0xff] ^
         Ax[6][auVar6._2_2_ & 0xff] ^ Ax[7][auVar6._10_2_ & 0xff];
    auVar15._8_8_ =
         Ax[1][(ushort)(auVar18._12_2_ >> 8)] ^ Ax[0][(ushort)(auVar18._4_2_ >> 8)] ^
         Ax[2][(ushort)(auVar16._4_2_ >> 8)] ^ Ax[3][(ushort)(auVar16._12_2_ >> 8)] ^
         Ax[4][(ushort)(auVar14._4_2_ >> 8)] ^ Ax[5][(ushort)(auVar14._12_2_ >> 8)] ^
         Ax[6][(ushort)(auVar6._4_2_ >> 8)] ^ Ax[7][(ushort)(auVar6._12_2_ >> 8)];
    auVar15._0_8_ =
         Ax[1][auVar18._12_2_ & 0xff] ^ Ax[0][auVar18._4_2_ & 0xff] ^ Ax[2][auVar16._4_2_ & 0xff] ^
         Ax[3][auVar16._12_2_ & 0xff] ^ Ax[4][auVar14._4_2_ & 0xff] ^ Ax[5][auVar14._12_2_ & 0xff] ^
         Ax[6][auVar6._4_2_ & 0xff] ^ Ax[7][auVar6._12_2_ & 0xff];
    auVar8 = auVar9 ^ auVar19;
    auVar10 = auVar12 ^ auVar17;
    auVar13 = auVar3 ^ auVar15;
    auVar7._8_8_ = Ax[1][(ushort)(auVar18._14_2_ >> 8)] ^ Ax[0][(ushort)(auVar18._6_2_ >> 8)] ^
                   Ax[2][(ushort)(auVar16._6_2_ >> 8)] ^ Ax[3][(ushort)(auVar16._14_2_ >> 8)] ^
                   Ax[4][(ushort)(auVar14._6_2_ >> 8)] ^ Ax[5][(ushort)(auVar14._14_2_ >> 8)] ^
                   Ax[6][(ushort)(auVar6._6_2_ >> 8)] ^ Ax[7][(ushort)(auVar6._14_2_ >> 8)];
    auVar7._0_8_ = Ax[1][auVar18._14_2_ & 0xff] ^ Ax[0][auVar18._6_2_ & 0xff] ^
                   Ax[2][auVar16._6_2_ & 0xff] ^ Ax[3][auVar16._14_2_ & 0xff] ^
                   Ax[4][auVar14._6_2_ & 0xff] ^ Ax[5][auVar14._14_2_ & 0xff] ^
                   Ax[6][auVar6._6_2_ & 0xff] ^ Ax[7][auVar6._14_2_ & 0xff];
    auVar6 = auVar11 ^ auVar7;
    auVar9._8_8_ = Ax[1][(ushort)(auVar8._8_2_ >> 8)] ^ Ax[0][auVar8._0_4_ >> 8 & 0xff] ^
                   Ax[2][auVar10._0_4_ >> 8 & 0xff] ^ Ax[3][(ushort)(auVar10._8_2_ >> 8)] ^
                   Ax[4][auVar13._0_4_ >> 8 & 0xff] ^ Ax[5][(ushort)(auVar13._8_2_ >> 8)] ^
                   Ax[6][auVar6._0_4_ >> 8 & 0xff] ^ Ax[7][(ushort)(auVar6._8_2_ >> 8)];
    auVar9._0_8_ = Ax[1][auVar8._8_2_ & 0xff] ^ Ax[0][auVar8._0_4_ & 0xff] ^
                   Ax[2][auVar10._0_4_ & 0xff] ^ Ax[3][auVar10._8_2_ & 0xff] ^
                   Ax[4][auVar13._0_4_ & 0xff] ^ Ax[5][auVar13._8_2_ & 0xff] ^
                   Ax[6][auVar6._0_4_ & 0xff] ^ Ax[7][auVar6._8_2_ & 0xff];
    auVar12._8_8_ =
         Ax[1][(ushort)(auVar8._10_2_ >> 8)] ^ Ax[0][(ushort)(auVar8._2_2_ >> 8)] ^
         Ax[2][(ushort)(auVar10._2_2_ >> 8)] ^ Ax[3][(ushort)(auVar10._10_2_ >> 8)] ^
         Ax[4][(ushort)(auVar13._2_2_ >> 8)] ^ Ax[5][(ushort)(auVar13._10_2_ >> 8)] ^
         Ax[6][(ushort)(auVar6._2_2_ >> 8)] ^ Ax[7][(ushort)(auVar6._10_2_ >> 8)];
    auVar12._0_8_ =
         Ax[1][auVar8._10_2_ & 0xff] ^ Ax[0][auVar8._2_2_ & 0xff] ^ Ax[2][auVar10._2_2_ & 0xff] ^
         Ax[3][auVar10._10_2_ & 0xff] ^ Ax[4][auVar13._2_2_ & 0xff] ^ Ax[5][auVar13._10_2_ & 0xff] ^
         Ax[6][auVar6._2_2_ & 0xff] ^ Ax[7][auVar6._10_2_ & 0xff];
    auVar3._8_8_ = Ax[1][(ushort)(auVar8._12_2_ >> 8)] ^ Ax[0][(ushort)(auVar8._4_2_ >> 8)] ^
                   Ax[2][(ushort)(auVar10._4_2_ >> 8)] ^ Ax[3][(ushort)(auVar10._12_2_ >> 8)] ^
                   Ax[4][(ushort)(auVar13._4_2_ >> 8)] ^ Ax[5][(ushort)(auVar13._12_2_ >> 8)] ^
                   Ax[6][(ushort)(auVar6._4_2_ >> 8)] ^ Ax[7][(ushort)(auVar6._12_2_ >> 8)];
    auVar3._0_8_ = Ax[1][auVar8._12_2_ & 0xff] ^ Ax[0][auVar8._4_2_ & 0xff] ^
                   Ax[2][auVar10._4_2_ & 0xff] ^ Ax[3][auVar10._12_2_ & 0xff] ^
                   Ax[4][auVar13._4_2_ & 0xff] ^ Ax[5][auVar13._12_2_ & 0xff] ^
                   Ax[6][auVar6._4_2_ & 0xff] ^ Ax[7][auVar6._12_2_ & 0xff];
    auVar11._8_8_ =
         Ax[1][(ushort)(auVar8._14_2_ >> 8)] ^ Ax[0][(ushort)(auVar8._6_2_ >> 8)] ^
         Ax[2][(ushort)(auVar10._6_2_ >> 8)] ^ Ax[3][(ushort)(auVar10._14_2_ >> 8)] ^
         Ax[4][(ushort)(auVar13._6_2_ >> 8)] ^ Ax[5][(ushort)(auVar13._14_2_ >> 8)] ^
         Ax[6][(ushort)(auVar6._6_2_ >> 8)] ^ Ax[7][(ushort)(auVar6._14_2_ >> 8)];
    auVar11._0_8_ =
         Ax[1][auVar8._14_2_ & 0xff] ^ Ax[0][auVar8._6_2_ & 0xff] ^ Ax[2][auVar10._6_2_ & 0xff] ^
         Ax[3][auVar10._14_2_ & 0xff] ^ Ax[4][auVar13._6_2_ & 0xff] ^ Ax[5][auVar13._14_2_ & 0xff] ^
         Ax[6][auVar6._6_2_ & 0xff] ^ Ax[7][auVar6._14_2_ & 0xff];
  }
  auVar19 = auVar19 ^ _DAT_001413f0;
  auVar17 = auVar17 ^ _DAT_00141400;
  auVar15 = auVar15 ^ _DAT_00141410;
  auVar7 = auVar7 ^ _DAT_00141420;
  auVar6._8_8_ = Ax[1][(ushort)(auVar19._8_2_ >> 8)] ^ Ax[0][auVar19._0_4_ >> 8 & 0xff] ^
                 Ax[2][auVar17._0_4_ >> 8 & 0xff] ^ Ax[3][(ushort)(auVar17._8_2_ >> 8)] ^
                 Ax[4][auVar15._0_4_ >> 8 & 0xff] ^ Ax[5][(ushort)(auVar15._8_2_ >> 8)] ^
                 Ax[6][auVar7._0_4_ >> 8 & 0xff] ^ Ax[7][(ushort)(auVar7._8_2_ >> 8)];
  auVar6._0_8_ = Ax[1][auVar19._8_2_ & 0xff] ^ Ax[0][auVar19._0_4_ & 0xff] ^
                 Ax[2][auVar17._0_4_ & 0xff] ^ Ax[3][auVar17._8_2_ & 0xff] ^
                 Ax[4][auVar15._0_4_ & 0xff] ^ Ax[5][auVar15._8_2_ & 0xff] ^
                 Ax[6][auVar7._0_4_ & 0xff] ^ Ax[7][auVar7._8_2_ & 0xff];
  auVar13._8_8_ =
       Ax[1][(ushort)(auVar19._10_2_ >> 8)] ^ Ax[0][(ushort)(auVar19._2_2_ >> 8)] ^
       Ax[2][(ushort)(auVar17._2_2_ >> 8)] ^ Ax[3][(ushort)(auVar17._10_2_ >> 8)] ^
       Ax[4][(ushort)(auVar15._2_2_ >> 8)] ^ Ax[5][(ushort)(auVar15._10_2_ >> 8)] ^
       Ax[6][(ushort)(auVar7._2_2_ >> 8)] ^ Ax[7][(ushort)(auVar7._10_2_ >> 8)];
  auVar13._0_8_ =
       Ax[1][auVar19._10_2_ & 0xff] ^ Ax[0][auVar19._2_2_ & 0xff] ^ Ax[2][auVar17._2_2_ & 0xff] ^
       Ax[3][auVar17._10_2_ & 0xff] ^ Ax[4][auVar15._2_2_ & 0xff] ^ Ax[5][auVar15._10_2_ & 0xff] ^
       Ax[6][auVar7._2_2_ & 0xff] ^ Ax[7][auVar7._10_2_ & 0xff];
  auVar10._8_8_ =
       Ax[1][(ushort)(auVar19._12_2_ >> 8)] ^ Ax[0][(ushort)(auVar19._4_2_ >> 8)] ^
       Ax[2][(ushort)(auVar17._4_2_ >> 8)] ^ Ax[3][(ushort)(auVar17._12_2_ >> 8)] ^
       Ax[4][(ushort)(auVar15._4_2_ >> 8)] ^ Ax[5][(ushort)(auVar15._12_2_ >> 8)] ^
       Ax[6][(ushort)(auVar7._4_2_ >> 8)] ^ Ax[7][(ushort)(auVar7._12_2_ >> 8)];
  auVar10._0_8_ =
       Ax[1][auVar19._12_2_ & 0xff] ^ Ax[0][auVar19._4_2_ & 0xff] ^ Ax[2][auVar17._4_2_ & 0xff] ^
       Ax[3][auVar17._12_2_ & 0xff] ^ Ax[4][auVar15._4_2_ & 0xff] ^ Ax[5][auVar15._12_2_ & 0xff] ^
       Ax[6][auVar7._4_2_ & 0xff] ^ Ax[7][auVar7._12_2_ & 0xff];
  auVar8._8_8_ = Ax[1][(ushort)(auVar19._14_2_ >> 8)] ^ Ax[0][(ushort)(auVar19._6_2_ >> 8)] ^
                 Ax[2][(ushort)(auVar17._6_2_ >> 8)] ^ Ax[3][(ushort)(auVar17._14_2_ >> 8)] ^
                 Ax[4][(ushort)(auVar15._6_2_ >> 8)] ^ Ax[5][(ushort)(auVar15._14_2_ >> 8)] ^
                 Ax[6][(ushort)(auVar7._6_2_ >> 8)] ^ Ax[7][(ushort)(auVar7._14_2_ >> 8)];
  auVar8._0_8_ = Ax[1][auVar19._14_2_ & 0xff] ^ Ax[0][auVar19._6_2_ & 0xff] ^
                 Ax[2][auVar17._6_2_ & 0xff] ^ Ax[3][auVar17._14_2_ & 0xff] ^
                 Ax[4][auVar15._6_2_ & 0xff] ^ Ax[5][auVar15._14_2_ & 0xff] ^
                 Ax[6][auVar7._6_2_ & 0xff] ^ Ax[7][auVar7._14_2_ & 0xff];
  *(undefined1 (*) [16])h = *(undefined1 (*) [16])h ^ *(undefined1 (*) [16])m ^ auVar9 ^ auVar6;
  *(undefined1 (*) [16])(h->QWORD + 2) =
       *(undefined1 (*) [16])(h->QWORD + 2) ^ auVar2 ^ auVar12 ^ auVar13;
  *(undefined1 (*) [16])(h->QWORD + 4) =
       *(undefined1 (*) [16])(h->QWORD + 4) ^ auVar4 ^ auVar3 ^ auVar10;
  *(undefined1 (*) [16])(h->QWORD + 6) =
       *(undefined1 (*) [16])(h->QWORD + 6) ^ auVar5 ^ auVar11 ^ auVar8;
  return;
}

Assistant:

static void g(union uint512_u *h, const union uint512_u * RESTRICT N,
              const union uint512_u * RESTRICT m)
{
#ifdef __GOST3411_HAS_SSE2__
    __m128i xmm0, xmm2, xmm4, xmm6; /* XMMR0-quadruple */
    __m128i xmm1, xmm3, xmm5, xmm7; /* XMMR1-quadruple */
    unsigned int i;

    LOAD(N, xmm0, xmm2, xmm4, xmm6);
    XLPS128M(h, xmm0, xmm2, xmm4, xmm6);

    ULOAD(m, xmm1, xmm3, xmm5, xmm7);
    XLPS128R(xmm0, xmm2, xmm4, xmm6, xmm1, xmm3, xmm5, xmm7);

    for (i = 0; i < 11; i++)
        ROUND128(i, xmm0, xmm2, xmm4, xmm6, xmm1, xmm3, xmm5, xmm7);

    XLPS128M((&C[11]), xmm0, xmm2, xmm4, xmm6);
    X128R(xmm0, xmm2, xmm4, xmm6, xmm1, xmm3, xmm5, xmm7);

    X128M(h, xmm0, xmm2, xmm4, xmm6);
    ULOAD(m, xmm1, xmm3, xmm5, xmm7);
    X128R(xmm0, xmm2, xmm4, xmm6, xmm1, xmm3, xmm5, xmm7);

    STORE(h, xmm0, xmm2, xmm4, xmm6);
# ifndef __i386__
    /* Restore the Floating-point status on the CPU */
    /* This is only required on MMX, but EXTRACT32 is using MMX */
    _mm_empty();
# endif
#else
    union uint512_u Ki, data;
    unsigned int i;

    XLPS(h, N, (&data));

    /* Starting E() */
    Ki = data;
    XLPS((&Ki), ((const union uint512_u *)&m[0]), (&data));

    for (i = 0; i < 11; i++)
        ROUND(i, (&Ki), (&data));

    XLPS((&Ki), (&C[11]), (&Ki));
    X((&Ki), (&data), (&data));
    /* E() done */

    X((&data), h, (&data));
    X((&data), m, h);
#endif
}